

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

pa_stream * __thiscall
anon_unknown.dwarf_23de0c::PulseMainloop::connectStream
          (PulseMainloop *this,char *device_name,unique_lock<std::mutex> *plock,pa_context *context,
          pa_stream_flags_t flags,pa_buffer_attr *attr,pa_sample_spec *spec,pa_channel_map *chanmap,
          BackendType type)

{
  code *pcVar1;
  undefined4 uVar2;
  pa_stream_state_t x;
  int iVar3;
  char *pcVar4;
  pa_stream *ppVar5;
  backend_exception *pbVar6;
  undefined8 uVar7;
  undefined8 in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int in_stack_00000018;
  pa_stream_state_t state;
  int err;
  pa_stream *stream;
  char *stream_id;
  int local_84;
  
  pcVar4 = "Capture Stream";
  if (in_stack_00000018 == 0) {
    pcVar4 = "Playback Stream";
  }
  ppVar5 = (pa_stream *)
           (*(anonymous_namespace)::ppa_stream_new)
                     (in_RCX,pcVar4,in_stack_00000008,in_stack_00000010);
  if (ppVar5 == (pa_stream *)0x0) {
    pbVar6 = (backend_exception *)__cxa_allocate_exception(0x30);
    pcVar1 = (anonymous_namespace)::ppa_strerror;
    uVar2 = (*(anonymous_namespace)::ppa_context_errno)(in_RCX);
    uVar7 = (*pcVar1)(uVar2);
    al::backend_exception::backend_exception(pbVar6,0xa005,"pa_stream_new() failed (%s)",uVar7);
    __cxa_throw(pbVar6,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  (*(anonymous_namespace)::ppa_stream_set_state_callback)(ppVar5,streamStateCallbackC,in_RDI);
  if (in_stack_00000018 == 0) {
    local_84 = (*(anonymous_namespace)::ppa_stream_connect_playback)(ppVar5,in_RSI,in_R9,in_R8D,0);
  }
  else {
    local_84 = (*(anonymous_namespace)::ppa_stream_connect_record)(ppVar5,in_RSI,in_R9,in_R8D);
  }
  if (-1 < local_84) {
    while( true ) {
      x = (*(anonymous_namespace)::ppa_stream_get_state)(ppVar5);
      if (x == PA_STREAM_READY) {
        (*(anonymous_namespace)::ppa_stream_set_state_callback)(ppVar5,0);
        return ppVar5;
      }
      iVar3 = PA_STREAM_IS_GOOD(x);
      if (iVar3 == 0) break;
      std::condition_variable::wait((unique_lock *)(in_RDI + 0x30));
    }
    uVar2 = (*(anonymous_namespace)::ppa_context_errno)(in_RCX);
    (*(anonymous_namespace)::ppa_stream_unref)(ppVar5);
    pbVar6 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar7 = (*(anonymous_namespace)::ppa_strerror)(uVar2);
    al::backend_exception::backend_exception(pbVar6,0xa004,"%s did not get ready (%s)",pcVar4,uVar7)
    ;
    __cxa_throw(pbVar6,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  (*(anonymous_namespace)::ppa_stream_unref)(ppVar5);
  pbVar6 = (backend_exception *)__cxa_allocate_exception(0x30);
  uVar7 = (*(anonymous_namespace)::ppa_strerror)(local_84);
  al::backend_exception::backend_exception(pbVar6,0xa004,"%s did not connect (%s)",pcVar4,uVar7);
  __cxa_throw(pbVar6,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

pa_stream *PulseMainloop::connectStream(const char *device_name,
    std::unique_lock<std::mutex> &plock, pa_context *context, pa_stream_flags_t flags,
    pa_buffer_attr *attr, pa_sample_spec *spec, pa_channel_map *chanmap, BackendType type)
{
    const char *stream_id{(type==BackendType::Playback) ? "Playback Stream" : "Capture Stream"};
    pa_stream *stream{pa_stream_new(context, stream_id, spec, chanmap)};
    if(!stream)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "pa_stream_new() failed (%s)",
            pa_strerror(pa_context_errno(context))};

    pa_stream_set_state_callback(stream, &streamStateCallbackC, this);

    int err{(type==BackendType::Playback) ?
        pa_stream_connect_playback(stream, device_name, attr, flags, nullptr, nullptr) :
        pa_stream_connect_record(stream, device_name, attr, flags)};
    if(err < 0)
    {
        pa_stream_unref(stream);
        throw al::backend_exception{ALC_INVALID_VALUE, "%s did not connect (%s)", stream_id,
            pa_strerror(err)};
    }

    pa_stream_state_t state;
    while((state=pa_stream_get_state(stream)) != PA_STREAM_READY)
    {
        if(!PA_STREAM_IS_GOOD(state))
        {
            err = pa_context_errno(context);
            pa_stream_unref(stream);
            throw al::backend_exception{ALC_INVALID_VALUE, "%s did not get ready (%s)", stream_id,
                pa_strerror(err)};
        }

        mCondVar.wait(plock);
    }
    pa_stream_set_state_callback(stream, nullptr, nullptr);

    return stream;
}